

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

size_t chacha20poly1305_decrypt
                 (ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,void *iv,void *aad
                 ,size_t aadlen)

{
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *nbytes;
  long lVar1;
  byte bVar2;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *p_Var3;
  uint8_t tag [16];
  byte local_48 [24];
  
  p_Var3 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0xffffffffffffffff;
  if (0xf < inlen) {
    chacha20poly1305_init(_ctx,iv,aad,aadlen);
    nbytes = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)(inlen - 0x10);
    cf_poly1305_update((cf_poly1305 *)&_ctx[3].do_encrypt_update,(uint8_t *)input,(size_t)nbytes);
    _ctx[6].do_encrypt_init = nbytes;
    chacha20poly1305_finalize((chacha20poly1305_context_t *)_ctx,local_48);
    lVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | local_48[lVar1] ^ *(byte *)((long)input + lVar1 + (inlen - 0x10));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    p_Var3 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0xffffffffffffffff;
    if (bVar2 == 0) {
      cf_chacha20_cipher((cf_chacha20_ctx *)&_ctx[1].do_encrypt_init,(uint8_t *)input,
                         (uint8_t *)output,(size_t)nbytes);
      p_Var3 = nbytes;
    }
    (*ptls_clear_memory)(local_48,0x10);
    (*ptls_clear_memory)(&_ctx[3].do_encrypt_update,0xb0);
  }
  return (size_t)p_Var3;
}

Assistant:

static size_t chacha20poly1305_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, const void *iv,
                                       const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tag[PTLS_CHACHA20POLY1305_TAG_SIZE];
    size_t ret;

    if (inlen < sizeof(tag))
        return SIZE_MAX;

    chacha20poly1305_init(&ctx->super, iv, aad, aadlen);

    cf_poly1305_update(&ctx->poly, input, inlen - sizeof(tag));
    ctx->textlen = inlen - sizeof(tag);

    chacha20poly1305_finalize(ctx, tag);
    if (mem_eq(tag, (const uint8_t *)input + inlen - sizeof(tag), sizeof(tag))) {
        cf_chacha20_cipher(&ctx->chacha, input, output, inlen - sizeof(tag));
        ret = inlen - sizeof(tag);
    } else {
        ret = SIZE_MAX;
    }

    ptls_clear_memory(tag, sizeof(tag));
    ptls_clear_memory(&ctx->poly, sizeof(ctx->poly));

    return ret;
}